

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall gl4cts::ShaderSubroutine::Utils::program::isProgramBinarySupported(program *this)

{
  bool bVar1;
  uint in_EAX;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLint n_program_binary_formats;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_get_program_binary");
  if (bVar1) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x87fe,(long)&uStack_18 + 4);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"glGetIntegerv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x185);
  }
  return 0 < uStack_18._4_4_;
}

Assistant:

bool Utils::program::isProgramBinarySupported() const
{
	glw::GLint n_program_binary_formats = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_context.getContextInfo().isExtensionSupported("GL_ARB_get_program_binary"))
	{
		gl.getIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &n_program_binary_formats);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");
	}

	return n_program_binary_formats > 0;
}